

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

int yaml_parser_scan_directive(yaml_parser_t *parser,yaml_token_t *token)

{
  size_t sVar1;
  size_t sVar2;
  yaml_mark_t start_mark_00;
  yaml_mark_t start_mark_01;
  yaml_mark_t yVar3;
  yaml_mark_t context_mark;
  int iVar4;
  bool bVar5;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_8c;
  int local_88;
  int local_84;
  int local_7c;
  int local_78;
  int local_74;
  yaml_char_t *local_70;
  yaml_char_t *prefix;
  yaml_char_t *handle;
  int minor;
  int major;
  yaml_char_t *name;
  yaml_mark_t end_mark;
  yaml_mark_t start_mark;
  yaml_token_t *token_local;
  yaml_parser_t *parser_local;
  
  _minor = (yaml_char_t *)0x0;
  prefix = (yaml_char_t *)0x0;
  local_70 = (yaml_char_t *)0x0;
  end_mark.column = (parser->mark).index;
  sVar1 = (parser->mark).line;
  sVar2 = (parser->mark).column;
  yVar3 = parser->mark;
  (parser->mark).index = (parser->mark).index + 1;
  (parser->mark).column = (parser->mark).column + 1;
  parser->unread = parser->unread - 1;
  if ((*(parser->buffer).pointer & 0x80) == 0) {
    local_74 = 1;
  }
  else {
    if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
      local_78 = 2;
    }
    else {
      if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
        local_7c = 3;
      }
      else {
        local_7c = 0;
        if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
          local_7c = 4;
        }
      }
      local_78 = local_7c;
    }
    local_74 = local_78;
  }
  (parser->buffer).pointer = (parser->buffer).pointer + local_74;
  iVar4 = yaml_parser_scan_directive_name(parser,yVar3,(yaml_char_t **)&minor);
  if (iVar4 != 0) {
    iVar4 = strcmp((char *)_minor,"YAML");
    if (iVar4 == 0) {
      start_mark_00.line = sVar1;
      start_mark_00.index = end_mark.column;
      start_mark_00.column = sVar2;
      iVar4 = yaml_parser_scan_version_directive_value
                        (parser,start_mark_00,(int *)((long)&handle + 4),(int *)&handle);
      if (iVar4 == 0) goto LAB_0011da89;
      name = (yaml_char_t *)(parser->mark).index;
      end_mark.index = (parser->mark).line;
      end_mark.line = (parser->mark).column;
      memset(token,0,0x50);
      token->type = YAML_VERSION_DIRECTIVE_TOKEN;
      (token->start_mark).index = end_mark.column;
      (token->start_mark).line = sVar1;
      (token->start_mark).column = sVar2;
      (token->end_mark).index = (size_t)name;
      (token->end_mark).line = end_mark.index;
      (token->end_mark).column = end_mark.line;
      (token->data).stream_start.encoding = handle._4_4_;
      (token->data).version_directive.minor = (int)handle;
    }
    else {
      iVar4 = strcmp((char *)_minor,"TAG");
      if (iVar4 != 0) {
        yVar3.line = sVar1;
        yVar3.index = end_mark.column;
        yVar3.column = sVar2;
        yaml_parser_set_scanner_error
                  (parser,"while scanning a directive",yVar3,"found unknown directive name");
        goto LAB_0011da89;
      }
      start_mark_01.line = sVar1;
      start_mark_01.index = end_mark.column;
      start_mark_01.column = sVar2;
      iVar4 = yaml_parser_scan_tag_directive_value(parser,start_mark_01,&prefix,&local_70);
      if (iVar4 == 0) goto LAB_0011da89;
      name = (yaml_char_t *)(parser->mark).index;
      end_mark.index = (parser->mark).line;
      end_mark.line = (parser->mark).column;
      memset(token,0,0x50);
      token->type = YAML_TAG_DIRECTIVE_TOKEN;
      (token->start_mark).index = end_mark.column;
      (token->start_mark).line = sVar1;
      (token->start_mark).column = sVar2;
      (token->end_mark).index = (size_t)name;
      (token->end_mark).line = end_mark.index;
      (token->end_mark).column = end_mark.line;
      (token->data).tag.handle = prefix;
      (token->data).tag.suffix = local_70;
    }
    if (parser->unread != 0) goto LAB_0011d15c;
    iVar4 = yaml_parser_update_buffer(parser,1);
    while (iVar4 != 0) {
LAB_0011d15c:
      do {
        bVar5 = true;
        if (*(parser->buffer).pointer != ' ') {
          bVar5 = *(parser->buffer).pointer == '\t';
        }
        if (!bVar5) {
          if (*(parser->buffer).pointer == '#') goto LAB_0011d2e9;
          goto LAB_0011d56b;
        }
        (parser->mark).index = (parser->mark).index + 1;
        (parser->mark).column = (parser->mark).column + 1;
        parser->unread = parser->unread - 1;
        if ((*(parser->buffer).pointer & 0x80) == 0) {
          local_84 = 1;
        }
        else {
          if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
            local_88 = 2;
          }
          else {
            if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
              local_8c = 3;
            }
            else {
              local_8c = 0;
              if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
                local_8c = 4;
              }
            }
            local_88 = local_8c;
          }
          local_84 = local_88;
        }
        (parser->buffer).pointer = (parser->buffer).pointer + local_84;
      } while (parser->unread != 0);
      iVar4 = yaml_parser_update_buffer(parser,1);
    }
  }
  goto LAB_0011da89;
LAB_0011d56b:
  if ((((((*(parser->buffer).pointer == '\r') || (*(parser->buffer).pointer == '\n')) ||
        ((*(parser->buffer).pointer == 0xc2 && ((parser->buffer).pointer[1] == 0x85)))) ||
       (((*(parser->buffer).pointer == 0xe2 && ((parser->buffer).pointer[1] == 0x80)) &&
        ((parser->buffer).pointer[2] == 0xa8)))) ||
      (((*(parser->buffer).pointer == 0xe2 && ((parser->buffer).pointer[1] == 0x80)) &&
       ((parser->buffer).pointer[2] == 0xa9)))) || (*(parser->buffer).pointer == '\0')) {
    if (((((*(parser->buffer).pointer == '\r') || (*(parser->buffer).pointer == '\n')) ||
         ((*(parser->buffer).pointer == 0xc2 && ((parser->buffer).pointer[1] == 0x85)))) ||
        (((*(parser->buffer).pointer == 0xe2 && ((parser->buffer).pointer[1] == 0x80)) &&
         ((parser->buffer).pointer[2] == 0xa8)))) ||
       (((*(parser->buffer).pointer == 0xe2 && ((parser->buffer).pointer[1] == 0x80)) &&
        ((parser->buffer).pointer[2] == 0xa9)))) {
      if ((parser->unread < 2) && (iVar4 = yaml_parser_update_buffer(parser,2), iVar4 == 0))
      goto LAB_0011da89;
      if ((*(parser->buffer).pointer == '\r') && ((parser->buffer).pointer[1] == '\n')) {
        (parser->mark).index = (parser->mark).index + 2;
        (parser->mark).column = 0;
        (parser->mark).line = (parser->mark).line + 1;
        parser->unread = parser->unread - 2;
        (parser->buffer).pointer = (parser->buffer).pointer + 2;
      }
      else if ((((*(parser->buffer).pointer == '\r') || (*(parser->buffer).pointer == '\n')) ||
               ((*(parser->buffer).pointer == 0xc2 && ((parser->buffer).pointer[1] == 0x85)))) ||
              ((((*(parser->buffer).pointer == 0xe2 && ((parser->buffer).pointer[1] == 0x80)) &&
                ((parser->buffer).pointer[2] == 0xa8)) ||
               (((*(parser->buffer).pointer == 0xe2 && ((parser->buffer).pointer[1] == 0x80)) &&
                ((parser->buffer).pointer[2] == 0xa9)))))) {
        (parser->mark).index = (parser->mark).index + 1;
        (parser->mark).column = 0;
        (parser->mark).line = (parser->mark).line + 1;
        parser->unread = parser->unread - 1;
        if ((*(parser->buffer).pointer & 0x80) == 0) {
          local_a0 = 1;
        }
        else {
          if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
            local_a4 = 2;
          }
          else {
            if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
              local_a8 = 3;
            }
            else {
              local_a8 = 0;
              if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
                local_a8 = 4;
              }
            }
            local_a4 = local_a8;
          }
          local_a0 = local_a4;
        }
        (parser->buffer).pointer = (parser->buffer).pointer + local_a0;
      }
    }
    yaml_free(_minor);
    return 1;
  }
  context_mark.line = sVar1;
  context_mark.index = end_mark.column;
  context_mark.column = sVar2;
  yaml_parser_set_scanner_error
            (parser,"while scanning a directive",context_mark,
             "did not find expected comment or line break");
  goto LAB_0011da89;
  while( true ) {
    (parser->mark).index = (parser->mark).index + 1;
    (parser->mark).column = (parser->mark).column + 1;
    parser->unread = parser->unread - 1;
    if ((*(parser->buffer).pointer & 0x80) == 0) {
      local_94 = 1;
    }
    else {
      if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
        local_98 = 2;
      }
      else {
        if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
          local_9c = 3;
        }
        else {
          local_9c = 0;
          if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
            local_9c = 4;
          }
        }
        local_98 = local_9c;
      }
      local_94 = local_98;
    }
    (parser->buffer).pointer = (parser->buffer).pointer + local_94;
    if ((parser->unread == 0) && (iVar4 = yaml_parser_update_buffer(parser,1), iVar4 == 0)) break;
LAB_0011d2e9:
    bVar5 = true;
    if (((((*(parser->buffer).pointer != '\r') && (bVar5 = true, *(parser->buffer).pointer != '\n'))
         && ((*(parser->buffer).pointer != 0xc2 ||
             (bVar5 = true, (parser->buffer).pointer[1] != 0x85)))) &&
        (((*(parser->buffer).pointer != 0xe2 || ((parser->buffer).pointer[1] != 0x80)) ||
         (bVar5 = true, (parser->buffer).pointer[2] != 0xa8)))) &&
       (((*(parser->buffer).pointer != 0xe2 || ((parser->buffer).pointer[1] != 0x80)) ||
        (bVar5 = true, (parser->buffer).pointer[2] != 0xa9)))) {
      bVar5 = *(parser->buffer).pointer == '\0';
    }
    if (bVar5) goto LAB_0011d56b;
  }
LAB_0011da89:
  yaml_free(local_70);
  yaml_free(prefix);
  yaml_free(_minor);
  return 0;
}

Assistant:

int
yaml_parser_scan_directive(yaml_parser_t *parser, yaml_token_t *token)
{
    yaml_mark_t start_mark, end_mark;
    yaml_char_t *name = NULL;
    int major, minor;
    yaml_char_t *handle = NULL, *prefix = NULL;

    /* Eat '%'. */

    start_mark = parser->mark;

    SKIP(parser);

    /* Scan the directive name. */

    if (!yaml_parser_scan_directive_name(parser, start_mark, &name))
        goto error;

    /* Is it a YAML directive? */

    if (strcmp((char *)name, "YAML") == 0)
    {
        /* Scan the VERSION directive value. */

        if (!yaml_parser_scan_version_directive_value(parser, start_mark,
                    &major, &minor))
            goto error;

        end_mark = parser->mark;

        /* Create a VERSION-DIRECTIVE token. */

        VERSION_DIRECTIVE_TOKEN_INIT(*token, major, minor,
                start_mark, end_mark);
    }

    /* Is it a TAG directive? */

    else if (strcmp((char *)name, "TAG") == 0)
    {
        /* Scan the TAG directive value. */

        if (!yaml_parser_scan_tag_directive_value(parser, start_mark,
                    &handle, &prefix))
            goto error;

        end_mark = parser->mark;

        /* Create a TAG-DIRECTIVE token. */

        TAG_DIRECTIVE_TOKEN_INIT(*token, handle, prefix,
                start_mark, end_mark);
    }

    /* Unknown directive. */

    else
    {
        yaml_parser_set_scanner_error(parser, "while scanning a directive",
                start_mark, "found unknown directive name");
        goto error;
    }

    /* Eat the rest of the line including any comments. */

    if (!CACHE(parser, 1)) goto error;

    while (IS_BLANK(parser->buffer)) {
        SKIP(parser);
        if (!CACHE(parser, 1)) goto error;
    }

    if (CHECK(parser->buffer, '#')) {
        while (!IS_BREAKZ(parser->buffer)) {
            SKIP(parser);
            if (!CACHE(parser, 1)) goto error;
        }
    }

    /* Check if we are at the end of the line. */

    if (!IS_BREAKZ(parser->buffer)) {
        yaml_parser_set_scanner_error(parser, "while scanning a directive",
                start_mark, "did not find expected comment or line break");
        goto error;
    }

    /* Eat a line break. */

    if (IS_BREAK(parser->buffer)) {
        if (!CACHE(parser, 2)) goto error;
        SKIP_LINE(parser);
    }

    yaml_free(name);

    return 1;

error:
    yaml_free(prefix);
    yaml_free(handle);
    yaml_free(name);
    return 0;
}